

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *other)

{
  size_t sVar1;
  TypedID<(spirv_cross::Types)1> *pTVar2;
  TypedID<(spirv_cross::Types)1> *pTVar3;
  size_t sVar4;
  
  if (this != other) {
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).buffer_size = 0;
    reserve(this,(other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).buffer_size
           );
    sVar1 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).buffer_size;
    if (sVar1 != 0) {
      pTVar2 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr;
      pTVar3 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr;
      sVar4 = 0;
      do {
        pTVar2[sVar4].id = pTVar3[sVar4].id;
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).buffer_size = sVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}